

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<6>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  int i;
  int index;
  RepeatedField<unsigned_long> *array;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32_t *)((long)field + 0x10),output)
    ;
    for (index = 0; index < *field; index = index + 1) {
      puVar2 = RepeatedField<unsigned_long>::Get((RepeatedField<unsigned_long> *)field,index);
      puVar1 = (unsigned_long *)output->ptr;
      *puVar1 = *puVar2;
      output->ptr = (uint8_t *)(puVar1 + 1);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}